

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O3

int demo_color_proc(DEMO_MENU *item,int msg,int extra)

{
  int iVar1;
  int iVar2;
  ALLEGRO_FONT *font;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  undefined4 uVar10;
  float in_XMM1_Da;
  float fVar11;
  float fVar12;
  int rgb [3];
  uint local_d0 [3];
  float local_c4;
  float local_c0;
  float local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  undefined8 local_78;
  ulong local_60;
  float local_58;
  undefined8 local_48;
  
  iVar6 = 1000;
  if (msg - 1U < 5) {
    iVar2 = screen_width / 0x12;
    switch(msg) {
    case 1:
      uVar9 = 0;
      local_78 = al_map_rgb(0xff,0xff,(((uint)item->flags >> 1 & 1) != 0) + -1);
      local_88 = in_XMM1_Da;
      local_48 = al_map_rgb(0xff,0xff,0xff);
      iVar5 = screen_width / 2 - (iVar2 * 3) / 2;
      local_58 = in_XMM1_Da;
      iVar6 = al_get_font_line_height(demo_data[1].dat);
      fVar11 = local_88;
      shadow_textprintf((ALLEGRO_FONT *)demo_data[1].dat,iVar5 + -8,extra,1,(int)item->name,
                        (undefined4)local_78,local_88);
      local_a8 = *(uint *)item->data;
      local_b4 = local_a8 & 0xff;
      local_d0[0] = local_a8 & 0xff;
      local_ac = local_a8 >> 8;
      local_b8 = local_a8 >> 8 & 0xff;
      local_d0[1] = local_b8;
      local_b0 = local_a8 >> 0x10;
      local_a4 = local_a8 >> 0x10 & 0xff;
      local_bc = (float)(extra + 5);
      local_8c = (float)(iVar6 + -1 + extra);
      local_90 = (float)(extra + 6);
      local_94 = (float)(iVar6 + -4 + extra);
      local_98 = (float)(extra + 3);
      local_9c = (float)(iVar6 + -3 + extra);
      local_60 = (ulong)(uint)extra;
      local_a0 = (float)(iVar6 + -5 + extra);
      local_d0[2] = local_a4;
      iVar6 = iVar5 + 2;
      do {
        iVar5 = (int)(local_d0[uVar9] * (iVar2 + -0xc)) / 0xff;
        local_c0 = (float)iVar6;
        local_c4 = (float)(iVar2 + iVar6 + -4);
        uVar10 = al_map_rgb(0,0,0);
        fVar12 = local_bc;
        al_draw_rectangle(local_c0,local_bc,local_c4,local_8c,uVar10,fVar11,0x3f800000);
        local_c0 = (float)(iVar6 + iVar5 + 1);
        local_c4 = (float)(iVar6 + 5 + iVar5);
        uVar10 = al_map_rgb(0,0,0);
        al_draw_filled_rectangle(local_c0,local_90,local_c4,local_94,uVar10,fVar12);
        uVar10 = (undefined4)local_78;
        fVar11 = local_88;
        if (uVar9 != (uint)item->extra) {
          uVar10 = (undefined4)local_48;
          fVar11 = local_58;
        }
        al_draw_rectangle((float)(iVar6 + -2),local_98,(float)(iVar2 + iVar6 + -6),local_9c,uVar10,
                          fVar11,0x3f800000);
        uVar10 = (undefined4)local_78;
        fVar12 = local_88;
        if (uVar9 != (uint)item->extra) {
          uVar10 = (undefined4)local_48;
          fVar12 = local_58;
        }
        iVar1 = iVar2 + iVar6;
        fVar11 = local_bc;
        al_draw_filled_rectangle
                  ((float)(iVar5 + iVar6),local_bc,(float)(iVar6 + iVar5 + 4),local_a0,uVar10,fVar12
                  );
        uVar9 = uVar9 + 1;
        iVar6 = iVar1;
      } while (uVar9 != 3);
      snprintf(demo_color_proc::buf,0x40,"%d,%d,%d",(ulong)local_b4,(ulong)local_b8,(ulong)local_a4)
      ;
      font = (ALLEGRO_FONT *)demo_data[1].dat;
      uVar10 = al_map_rgb(local_a8 & 0xff,local_ac & 0xff,local_b0 & 0xff);
      shadow_textprintf(font,iVar1 + 6,(int)local_60,0,0x11a800,uVar10,fVar11);
      iVar6 = 1000;
      break;
    case 3:
      uVar7 = *(uint *)item->data;
      local_d0[0] = uVar7 & 0xff;
      local_d0[1] = uVar7 >> 8 & 0xff;
      local_d0[2] = uVar7 >> 0x10 & 0xff;
      _Var4 = key_pressed(0x52);
      bVar3 = false;
      if ((_Var4) && (0 < (int)local_d0[item->extra])) {
        _Var4 = key_down(0xd7);
        if ((_Var4) || (_Var4 = key_down(0xd8), _Var4)) {
          local_d0[item->extra] = local_d0[item->extra] - 1;
        }
        else {
          uVar7 = 0x10;
          if (0x10 < (int)local_d0[item->extra]) {
            uVar7 = local_d0[item->extra];
          }
          local_d0[item->extra] = uVar7 - 0x10;
        }
        bVar3 = true;
      }
      _Var4 = key_pressed(0x53);
      if ((_Var4) && ((int)local_d0[item->extra] < 0xff)) {
        _Var4 = key_down(0xd7);
        if ((_Var4) || (_Var4 = key_down(0xd8), _Var4)) {
          local_d0[item->extra] = local_d0[item->extra] + 1;
        }
        else {
          uVar7 = 0xef;
          if ((int)local_d0[item->extra] < 0xef) {
            uVar7 = local_d0[item->extra];
          }
          local_d0[item->extra] = uVar7 + 0x10;
        }
        bVar3 = true;
      }
      _Var4 = key_pressed(0x40);
      if (_Var4) {
        _Var4 = key_down(0xd7);
        if ((_Var4) || (_Var4 = key_down(0xd8), _Var4)) {
          iVar2 = item->extra;
          item->extra = iVar2 + -1;
          if (iVar2 < 1) {
            item->extra = iVar2 + 2;
          }
        }
        else {
          item->extra = item->extra + ((item->extra + 1) / 3) * -3 + 1;
        }
        play_sound_id(7,0xff,0x80,-100,0);
        if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
          (*item->on_activate)(item);
        }
      }
      if (bVar3) {
        *(uint *)item->data = local_d0[2] * 0x10000 + local_d0[1] * 0x100 + local_d0[0];
        play_sound_id(7,0xff,0x80,-100,0);
        if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
          (*item->on_activate)(item);
        }
      }
      break;
    case 4:
      iVar6 = al_get_text_width(demo_data[1].dat,item->name);
      iVar5 = al_get_text_width(demo_data[1].dat,"255,255,255");
      if (iVar2 * 3 + iVar5 * 2 + 0x10 < iVar2 * 3 + 0x10 + iVar6 * 2) {
        pcVar8 = item->name;
      }
      else {
        pcVar8 = "255,255,255";
      }
      iVar6 = al_get_text_width(demo_data[1].dat,pcVar8);
      iVar6 = iVar2 * 3 + 0x10 + iVar6 * 2;
      break;
    case 5:
      iVar6 = al_get_font_line_height(demo_data[1].dat);
      return iVar6;
    }
    return iVar6;
  }
  return 1000;
}

Assistant:

int demo_color_proc(DEMO_MENU * item, int msg, int extra)
{
   int x, h, cw, cx, i, c;
   ALLEGRO_COLOR col1, col2;
   int rgb[3];
   static char buf[64];
   int changed = 0;
   int slider_width = screen_width / 6;

   slider_width /= 3;
   slider_width -= 4;

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (item->flags & DEMO_MENU_SELECTED) {
         col1 = al_map_rgb(255, 255, 0);
         col2 = al_map_rgb(255, 255, 255);
      } else {
         col1 = al_map_rgb(255, 255, 255);
         col2 = al_map_rgb(255, 255, 255);
      }

      x = screen_width / 2 - (slider_width + 4) * 3 / 2;
      h = al_get_font_line_height(demo_font);

      shadow_textprintf(demo_font, x - 8, extra, col1,
                      1, item->name);

      c = *(int *)(item->data);
      rgb[0] = c & 255;
      rgb[1] = (c >> 8) & 255;
      rgb[2] = (c >> 16) & 255;

      for (i = 0; i < 3; i++) {
         cw = 4;
         cx = (slider_width - 4 - cw) * rgb[i] / 255;

         al_draw_rectangle(x + 2, extra + 5,
              x + slider_width + 2, extra + h - 1, al_map_rgb(0, 0, 0), 1);
         al_draw_filled_rectangle(x + 3 + cx, extra + 6,
                  x + 3 + cx + cw, extra + h - 4, al_map_rgb(0, 0, 0));

         al_draw_rectangle(x, extra + 3, x + slider_width,
              extra + h - 3, item->extra == i ? col1 : col2, 1);
         al_draw_filled_rectangle(x + 2 + cx, extra + 5,
                  x + 2 + cx + cw, extra + h - 5,
                  item->extra == i ? col1 : col2);

         x += slider_width + 4;
      }

      snprintf(buf, sizeof(buf), "%d,%d,%d", rgb[0], rgb[1], rgb[2]);
      shadow_textprintf(demo_font, x + 8, extra, al_map_rgb(rgb[0], rgb[1], rgb[2]), 0, buf);
   } else if (msg == DEMO_MENU_MSG_KEY) {
      c = *(int *)(item->data);

      rgb[0] = (c >> 0) & 255;
      rgb[1] = (c >> 8) & 255;
      rgb[2] = (c >> 16) & 255;
   
   

     if (key_pressed(ALLEGRO_KEY_LEFT)) {
         if (rgb[item->extra] > 0) {
            if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
               --rgb[item->extra];
            } else {
               rgb[item->extra] -= 16;
               rgb[item->extra] = MAX(0, rgb[item->extra]);
            }

            changed = 1;
         }
      }

      if (key_pressed(ALLEGRO_KEY_RIGHT)) {
         if (rgb[item->extra] < 255) {
            if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
               ++rgb[item->extra];
            } else {
               rgb[item->extra] += 16;
               rgb[item->extra] = MIN(255, rgb[item->extra]);
            }

            changed = 1;
         }
      }

      if (key_pressed(ALLEGRO_KEY_TAB)) {
         if (key_down(ALLEGRO_KEY_LSHIFT) || key_down(ALLEGRO_KEY_RSHIFT)) {
            --item->extra;
            if (item->extra < 0) {
               item->extra += 3;
            }
         } else {
            ++item->extra;
            item->extra %= 3;
         }
         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
         if (item->on_activate) {
            item->on_activate(item);
         }
      }

      if (changed) {
         *(int *)(item->data) = rgb[0] + (rgb[1] << 8) + (rgb[2] << 16);

         play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);

         if (item->on_activate) {
            item->on_activate(item);
         }
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH) {
      return MAX(al_get_text_width(demo_font, item->name) * 2 + 8 * 2 +
                 3 * (slider_width + 4),
                 8 * 2 + 3 * (slider_width + 4) +
                 2 * al_get_text_width(demo_font, "255,255,255"));
   } else if (msg == DEMO_MENU_MSG_HEIGHT) {
      return al_get_font_line_height(demo_font);
   }

   return DEMO_MENU_CONTINUE;
}